

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

size_t __thiscall PolicyInformation::SetDataSize(PolicyInformation *this)

{
  size_t sVar1;
  size_t sVar2;
  PolicyInformation *this_local;
  
  sVar1 = DerBase::EncodedSize(&(this->policyIdentifier).super_DerBase);
  sVar2 = GetEncodedSize<PolicyQualifierInfo>(&this->policyQualifiers);
  (this->super_DerBase).cbData = sVar1 + sVar2;
  return sVar1 + sVar2;
}

Assistant:

virtual size_t SetDataSize() override
	{
		return (cbData = policyIdentifier.EncodedSize() + GetEncodedSize(policyQualifiers));
	}